

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# object.cpp
# Opt level: O2

void __thiscall
ObjectTest_set_vector_Test::ObjectTest_set_vector_Test(ObjectTest_set_vector_Test *this)

{
  testing::Test::Test(&this->super_Test);
  *(undefined ***)this = &PTR__Test_004a2340;
  return;
}

Assistant:

TEST(ObjectTest, set_vector) {
	object obj;

	obj.set(std::vector<bool>{ true });

	EXPECT_TRUE(obj.has<std::vector<bool>>());
	EXPECT_EQ(obj.get<std::vector<bool>>(), std::vector<bool>{ true });
	EXPECT_TRUE(obj.has<std::vector<object>>());
	EXPECT_EQ(obj.get<std::vector<object>>().size(), 1U);
	EXPECT_TRUE(obj.has<std::vector<int>>());
	EXPECT_EQ(obj.get<std::vector<int>>().size(), 0U);
	EXPECT_FALSE(obj.has<bool>());
	EXPECT_FALSE(obj.get<bool>());

	obj.set(std::vector<bool>{});

	EXPECT_TRUE(obj.has<std::vector<bool>>());
	EXPECT_EQ(obj.get<std::vector<bool>>().size(), 0U);
	EXPECT_TRUE(obj.has<std::vector<object>>());
	EXPECT_EQ(obj.get<std::vector<object>>().size(), 0U);
	EXPECT_TRUE(obj.has<std::vector<int>>());
	EXPECT_EQ(obj.get<std::vector<int>>().size(), 0U);
	EXPECT_FALSE(obj.has<bool>());
	EXPECT_FALSE(obj.get<bool>());
}